

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_coding.cc
# Opt level: O3

void anon_unknown.dwarf_d900::Encode
               (Node *node,string *code,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *codewords)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_50;
  
  if (node != (Node *)0x0) {
    if (-1 < (long)node->symbol_) {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((codewords->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + node->symbol_));
      return;
    }
    pNVar2 = node->left_;
    paVar1 = &local_50.field_2;
    pcVar3 = (code->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + code->_M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    Encode(pNVar2,&local_50,codewords);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pNVar2 = node->right_;
    pcVar3 = (code->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + code->_M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    Encode(pNVar2,&local_50,codewords);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Encode(const Node* node, const std::string& code,
            std::vector<std::string>* codewords) {
  if (NULL == node) return;

  const int symbol(node->GetSymbol());
  if (0 <= symbol) {
    (*codewords)[symbol] = code;
  } else {
    Encode(node->GetLeft(), code + "0", codewords);
    Encode(node->GetRight(), code + "1", codewords);
  }
}